

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O1

void __thiscall
dxil_spv::SPIRVModule::register_builtin_shader_output(SPIRVModule *this,Id id,BuiltIn builtin)

{
  _Head_base<0UL,_dxil_spv::SPIRVModule::Impl_*,_false> _Var1;
  mapped_type mVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  mapped_type local_28;
  Id local_24;
  
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<dxil_spv::SPIRVModule::Impl,_std::default_delete<dxil_spv::SPIRVModule::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_dxil_spv::SPIRVModule::Impl_*,_std::default_delete<dxil_spv::SPIRVModule::Impl>_>
       .super__Head_base<0UL,_dxil_spv::SPIRVModule::Impl_*,_false>._M_head_impl;
  _local_28 = CONCAT44(id,builtin);
  pmVar3 = std::__detail::
           _Map_base<spv::BuiltIn,_std::pair<const_spv::BuiltIn,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_spv::BuiltIn,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<spv::BuiltIn>,_std::hash<spv::BuiltIn>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<spv::BuiltIn,_std::pair<const_spv::BuiltIn,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_spv::BuiltIn,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<spv::BuiltIn>,_std::hash<spv::BuiltIn>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&(_Var1._M_head_impl)->builtins_output,&local_28);
  *pmVar3 = id;
  mVar2 = local_28;
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv::BuiltIn>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_spv::BuiltIn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spv::BuiltIn>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_spv::BuiltIn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&(_Var1._M_head_impl)->id_to_builtin_output,&local_24);
  *pmVar4 = mVar2;
  return;
}

Assistant:

void SPIRVModule::register_builtin_shader_output(spv::Id id, spv::BuiltIn builtin)
{
	impl->register_builtin_shader_output(id, builtin);
}